

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInfo.cpp
# Opt level: O0

InfoStatus
checkInfo(HighsLogOptions *report_log_options,
         vector<InfoRecord_*,_std::allocator<InfoRecord_*>_> *info_records)

{
  _func_int **pp_Var1;
  uint uVar2;
  uint uVar3;
  HighsLogOptions *pHVar4;
  __type _Var5;
  size_type sVar6;
  const_reference ppIVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  vector<InfoRecord_*,_std::allocator<InfoRecord_*>_> *in_RSI;
  HighsLogOptions *in_RDI;
  InfoRecordDouble *check_info_2;
  HighsInt check_index_3;
  double *value_pointer_2;
  InfoRecordDouble *info_2;
  InfoRecordInt *check_info_1;
  HighsInt check_index_2;
  HighsInt *value_pointer_1;
  InfoRecordInt *info_1;
  InfoRecordInt64 *check_info;
  HighsInt check_index_1;
  int64_t *value_pointer;
  InfoRecordInt64 *info;
  string check_name;
  HighsInt check_index;
  HighsInfoType type;
  string name;
  HighsInt index;
  HighsInt num_info;
  bool error_found;
  undefined4 in_stack_fffffffffffffeb8;
  uint in_stack_fffffffffffffebc;
  HighsLogOptions *in_stack_fffffffffffffec0;
  uint local_d4;
  uint local_b4;
  uint local_94;
  string local_70 [32];
  uint local_50;
  HighsInfoType local_4c;
  string local_48 [36];
  uint local_24;
  int local_20;
  byte local_19;
  vector<InfoRecord_*,_std::allocator<InfoRecord_*>_> *local_18;
  HighsLogOptions *local_10;
  InfoStatus local_4;
  
  local_19 = 0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  sVar6 = std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::size(in_RSI);
  local_20 = (int)sVar6;
  for (local_24 = 0; (int)local_24 < local_20; local_24 = local_24 + 1) {
    ppIVar7 = std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::operator[]
                        (local_18,(long)(int)local_24);
    std::__cxx11::string::string(local_48,(string *)&(*ppIVar7)->name);
    ppIVar7 = std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::operator[]
                        (local_18,(long)(int)local_24);
    local_4c = (*ppIVar7)->type;
    for (local_50 = 0; (int)local_50 < local_20; local_50 = local_50 + 1) {
      if (local_50 != local_24) {
        ppIVar7 = std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::operator[]
                            (local_18,(long)(int)local_50);
        std::__cxx11::string::string(local_70,(string *)&(*ppIVar7)->name);
        _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffec0,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        pHVar4 = local_10;
        uVar3 = local_24;
        if (_Var5) {
          uVar8 = std::__cxx11::string::c_str();
          uVar2 = local_50;
          uVar9 = std::__cxx11::string::c_str();
          highsLogUser(pHVar4,kError,
                       "checkInfo: Info %d (\"%s\") has the same name as info %d \"%s\"\n",
                       (ulong)uVar3,uVar8,(ulong)uVar2,uVar9);
          local_19 = 1;
        }
        std::__cxx11::string::~string(local_70);
      }
    }
    if (local_4c == kInt64) {
      ppIVar7 = std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::operator[]
                          (local_18,(long)(int)local_24);
      pp_Var1 = (*ppIVar7)[1]._vptr_InfoRecord;
      for (local_94 = 0; (int)local_94 < local_20; local_94 = local_94 + 1) {
        if (local_94 != local_24) {
          ppIVar7 = std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::operator[]
                              (local_18,(long)(int)local_94);
          pHVar4 = local_10;
          uVar3 = local_24;
          if (((*ppIVar7)->type == kInt64) && ((*ppIVar7)[1]._vptr_InfoRecord == pp_Var1)) {
            uVar8 = std::__cxx11::string::c_str();
            uVar9 = std::__cxx11::string::c_str();
            highsLogUser(pHVar4,kError,
                         "checkInfo: Info %d (\"%s\") has the same value pointer as info %d (\"%s\")\n"
                         ,(ulong)uVar3,uVar8,(ulong)local_94,uVar9);
            local_19 = 1;
          }
        }
      }
    }
    else if (local_4c == kInt) {
      ppIVar7 = std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::operator[]
                          (local_18,(long)(int)local_24);
      pp_Var1 = (*ppIVar7)[1]._vptr_InfoRecord;
      for (local_b4 = 0; (int)local_b4 < local_20; local_b4 = local_b4 + 1) {
        if (local_b4 != local_24) {
          ppIVar7 = std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::operator[]
                              (local_18,(long)(int)local_b4);
          uVar3 = local_24;
          if (((*ppIVar7)->type == kInt) && ((*ppIVar7)[1]._vptr_InfoRecord == pp_Var1)) {
            in_stack_fffffffffffffec0 = local_10;
            uVar8 = std::__cxx11::string::c_str();
            uVar9 = std::__cxx11::string::c_str();
            highsLogUser(in_stack_fffffffffffffec0,kError,
                         "checkInfo: Info %d (\"%s\") has the same value pointer as info %d (\"%s\")\n"
                         ,(ulong)uVar3,uVar8,(ulong)local_b4,uVar9);
            local_19 = 1;
          }
        }
      }
    }
    else if (local_4c == kDouble) {
      ppIVar7 = std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::operator[]
                          (local_18,(long)(int)local_24);
      pp_Var1 = (*ppIVar7)[1]._vptr_InfoRecord;
      for (local_d4 = 0; (int)local_d4 < local_20; local_d4 = local_d4 + 1) {
        if (local_d4 != local_24) {
          ppIVar7 = std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::operator[]
                              (local_18,(long)(int)local_d4);
          pHVar4 = local_10;
          uVar3 = local_24;
          if (((*ppIVar7)->type == kDouble) && ((*ppIVar7)[1]._vptr_InfoRecord == pp_Var1)) {
            uVar8 = std::__cxx11::string::c_str();
            in_stack_fffffffffffffebc = local_d4;
            uVar9 = std::__cxx11::string::c_str();
            highsLogUser(pHVar4,kError,
                         "checkInfo: Info %d (\"%s\") has the same value pointer as info %d (\"%s\")\n"
                         ,(ulong)uVar3,uVar8,(ulong)in_stack_fffffffffffffebc,uVar9);
            local_19 = 1;
          }
        }
      }
    }
    std::__cxx11::string::~string(local_48);
  }
  if ((local_19 & 1) == 0) {
    highsLogUser(local_10,kInfo,"checkInfo: Info are OK\n");
    local_4 = kOk;
  }
  else {
    local_4 = kIllegalValue;
  }
  return local_4;
}

Assistant:

InfoStatus checkInfo(const HighsLogOptions& report_log_options,
                     const std::vector<InfoRecord*>& info_records) {
  bool error_found = false;
  HighsInt num_info = info_records.size();
  for (HighsInt index = 0; index < num_info; index++) {
    std::string name = info_records[index]->name;
    HighsInfoType type = info_records[index]->type;
    // Check that there are no other info with the same name
    for (HighsInt check_index = 0; check_index < num_info; check_index++) {
      if (check_index == index) continue;
      std::string check_name = info_records[check_index]->name;
      if (check_name == name) {
        highsLogUser(report_log_options, HighsLogType::kError,
                     "checkInfo: Info %" HIGHSINT_FORMAT
                     " (\"%s\") has the same name as info %" HIGHSINT_FORMAT
                     " \"%s\"\n",
                     index, name.c_str(), check_index, check_name.c_str());
        error_found = true;
      }
    }
    if (type == HighsInfoType::kInt64) {
      // Check int64_t info
      InfoRecordInt64& info = ((InfoRecordInt64*)info_records[index])[0];
      // Check that there are no other info with the same value pointers
      int64_t* value_pointer = info.value;
      for (HighsInt check_index = 0; check_index < num_info; check_index++) {
        if (check_index == index) continue;
        InfoRecordInt64& check_info =
            ((InfoRecordInt64*)info_records[check_index])[0];
        if (check_info.type == HighsInfoType::kInt64) {
          if (check_info.value == value_pointer) {
            highsLogUser(report_log_options, HighsLogType::kError,
                         "checkInfo: Info %" HIGHSINT_FORMAT
                         " (\"%s\") has the same value "
                         "pointer as info %" HIGHSINT_FORMAT " (\"%s\")\n",
                         index, info.name.c_str(), check_index,
                         check_info.name.c_str());
            error_found = true;
          }
        }
      }
    } else if (type == HighsInfoType::kInt) {
      // Check HighsInt info
      InfoRecordInt& info = ((InfoRecordInt*)info_records[index])[0];
      // Check that there are no other info with the same value pointers
      HighsInt* value_pointer = info.value;
      for (HighsInt check_index = 0; check_index < num_info; check_index++) {
        if (check_index == index) continue;
        InfoRecordInt& check_info =
            ((InfoRecordInt*)info_records[check_index])[0];
        if (check_info.type == HighsInfoType::kInt) {
          if (check_info.value == value_pointer) {
            highsLogUser(report_log_options, HighsLogType::kError,
                         "checkInfo: Info %" HIGHSINT_FORMAT
                         " (\"%s\") has the same value "
                         "pointer as info %" HIGHSINT_FORMAT " (\"%s\")\n",
                         index, info.name.c_str(), check_index,
                         check_info.name.c_str());
            error_found = true;
          }
        }
      }
    } else if (type == HighsInfoType::kDouble) {
      // Check double info
      InfoRecordDouble& info = ((InfoRecordDouble*)info_records[index])[0];
      // Check that there are no other info with the same value pointers
      double* value_pointer = info.value;
      for (HighsInt check_index = 0; check_index < num_info; check_index++) {
        if (check_index == index) continue;
        InfoRecordDouble& check_info =
            ((InfoRecordDouble*)info_records[check_index])[0];
        if (check_info.type == HighsInfoType::kDouble) {
          if (check_info.value == value_pointer) {
            highsLogUser(report_log_options, HighsLogType::kError,
                         "checkInfo: Info %" HIGHSINT_FORMAT
                         " (\"%s\") has the same value "
                         "pointer as info %" HIGHSINT_FORMAT " (\"%s\")\n",
                         index, info.name.c_str(), check_index,
                         check_info.name.c_str());
            error_found = true;
          }
        }
      }
    }
  }
  if (error_found) return InfoStatus::kIllegalValue;
  highsLogUser(report_log_options, HighsLogType::kInfo,
               "checkInfo: Info are OK\n");
  return InfoStatus::kOk;
}